

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuousPageStack.h
# Opt level: O3

void __thiscall
ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::PopTo
          (ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *this,size_t position)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  
  uVar4 = (this->super_ContinuousPageStack<1UL>).nextTop;
  if (uVar4 < position) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,0x20e,"(position <= this->nextTop)","position <= this->nextTop");
    if (!bVar2) goto LAB_00ef2f95;
    *puVar3 = 0;
    uVar4 = (this->super_ContinuousPageStack<1UL>).nextTop;
  }
  if (uVar4 != position) {
    if (uVar4 < position + 8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,0x211,"(position + sizeof(VariableElement) <= this->nextTop)",
                         "position + sizeof(VariableElement) <= this->nextTop");
      if (!bVar2) goto LAB_00ef2f95;
      *puVar3 = 0;
    }
    if ((this->super_ContinuousPageStack<1UL>).bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar2) goto LAB_00ef2f95;
      *puVar3 = 0;
    }
    uVar4 = (this->super_ContinuousPageStack<1UL>).nextTop;
    this->topElementSize =
         *(size_t *)
          ((long)&(this->super_ContinuousPageStack<1UL>).pageAllocation[1].pageCount + position);
    if (uVar4 < position) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,300,"(position <= nextTop)","position <= nextTop");
      if (!bVar2) {
LAB_00ef2f95:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  (this->super_ContinuousPageStack<1UL>).nextTop = position;
  return;
}

Assistant:

inline void ContinuousPageStackOfVariableElements<T, InitialPageCount>::PopTo(const size_t position)
{
    Assert(position <= this->nextTop);
    if(position != this->nextTop)
    {
        Assert(position + sizeof(VariableElement) <= this->nextTop);
        topElementSize = reinterpret_cast<VariableElement *>(&this->Buffer()[position])->PreviousElementSize();
    }
    ContinuousPageStack<InitialPageCount>::PopTo(position);
}